

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChIterativeSolverVI.cpp
# Opt level: O3

void __thiscall chrono::ChIterativeSolverVI::ChIterativeSolverVI(ChIterativeSolverVI *this)

{
  ChIterativeSolver::ChIterativeSolver(&this->super_ChIterativeSolver,0x32,0.0,true,false);
  (this->super_ChSolverVI).super_ChSolver.verbose = false;
  (this->super_ChSolverVI).super_ChSolver.output_dir._M_dataplus._M_p =
       (pointer)&(this->super_ChSolverVI).super_ChSolver.output_dir.field_2;
  (this->super_ChSolverVI).super_ChSolver.output_dir._M_string_length = 0;
  (this->super_ChSolverVI).super_ChSolver.output_dir.field_2._M_local_buf[0] = '\0';
  (this->super_ChSolverVI).super_ChSolver.frame_id._M_dataplus._M_p =
       (pointer)&(this->super_ChSolverVI).super_ChSolver.frame_id.field_2;
  (this->super_ChSolverVI).super_ChSolver.frame_id._M_string_length = 0;
  (this->super_ChSolverVI).super_ChSolver.frame_id.field_2._M_local_buf[0] = '\0';
  (this->super_ChIterativeSolver)._vptr_ChIterativeSolver =
       (_func_int **)&PTR__ChIterativeSolverVI_00b39ec8;
  (this->super_ChSolverVI).super_ChSolver._vptr_ChSolver =
       (_func_int **)&PTR__ChIterativeSolverVI_00b39f10;
  this->m_iterations = 0;
  this->m_omega = 1.0;
  this->m_shlambda = 1.0;
  this->record_violation_history = false;
  (this->violation_history).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->violation_history).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->violation_history).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->dlambda_history).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->violation_history).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->dlambda_history).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->dlambda_history).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->dlambda_history).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

ChIterativeSolverVI::ChIterativeSolverVI()
    : ChIterativeSolver(50, 0.0, true, false),
      m_omega(1.0),
      m_shlambda(1.0),
      m_iterations(0),
      record_violation_history(false) {}